

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O3

void ccall_classify_ct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  CTSize CVar1;
  uint uVar2;
  uint uVar3;
  CType *ct_00;
  
  uVar3 = ct->info;
  if (uVar3 >> 0x1c != 1) {
    if (uVar3 >> 0x1c == 3) {
      uVar2 = ct->size;
      if (uVar2 != 0) {
        ct_00 = (CType *)((long)&cts->tab->info + (ulong)((uVar3 & 0xffff) << 4));
        CVar1 = ct_00->size;
        uVar3 = 0;
        do {
          ccall_classify_ct(cts,ct_00,rcl,ofs + uVar3);
          uVar3 = uVar3 + CVar1;
        } while (uVar3 < uVar2);
      }
    }
    else {
      uVar2 = 4;
      if ((ct->size - 1 & ofs) == 0) {
        uVar2 = ((uVar3 & 0xf4000000) == 0x4000000) + 1;
      }
      rcl[7 < ofs] = rcl[7 < ofs] | uVar2;
    }
    return;
  }
  ccall_classify_struct(cts,ct,rcl,ofs);
  return;
}

Assistant:

static void ccall_classify_ct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ctype_isarray(ct->info)) {
    CType *cct = ctype_rawchild(cts, ct);
    CTSize eofs, esz = cct->size, asz = ct->size;
    for (eofs = 0; eofs < asz; eofs += esz)
      ccall_classify_ct(cts, cct, rcl, ofs+eofs);
  } else if (ctype_isstruct(ct->info)) {
    ccall_classify_struct(cts, ct, rcl, ofs);
  } else {
    int cl = ctype_isfp(ct->info) ? CCALL_RCL_SSE : CCALL_RCL_INT;
    lua_assert(ctype_hassize(ct->info));
    if ((ofs & (ct->size-1))) cl = CCALL_RCL_MEM;  /* Unaligned. */
    rcl[(ofs >= 8)] |= cl;
  }
}